

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O1

void __thiscall QSqlQueryModel::setQuery(QSqlQueryModel *this,QSqlQuery *query)

{
  QSqlRecord *other;
  QSqlQuery *this_00;
  int *piVar1;
  QSqlQueryModelPrivate *this_01;
  long lVar2;
  QExplicitlySharedDataPointer<QSqlErrorPrivate> QVar3;
  QSqlQueryPrivate *pQVar4;
  QSqlErrorPrivate *pQVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  QSqlDriver *pQVar10;
  QSqlQueryModelPrivate *d;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QSqlRecord newRec;
  QString local_a8;
  QString local_88;
  QSqlError local_68;
  QSqlRecord local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QSqlQueryModelPrivate **)&this->field_0x8;
  if (this_01->nestedResetLevel == 0) {
    QAbstractItemModel::beginResetModel();
  }
  this_01->nestedResetLevel = this_01->nestedResetLevel + 1;
  local_60.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
       (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xaaaaaaaaaaaaaaaa;
  QSqlQuery::record((QSqlQuery *)&local_60);
  other = &this_01->rec;
  bVar6 = QSqlRecord::operator==(&local_60,other);
  lVar2 = (this_01->colOffsets).super_QVLABase<int>.super_QVLABaseBase.s;
  iVar8 = QSqlRecord::count(&local_60);
  if ((!bVar6) || (lVar2 != iVar8)) {
    iVar8 = QSqlRecord::count(&local_60);
    QSqlQueryModelPrivate::initColOffsets(this_01,iVar8);
  }
  (this_01->bottom).r = -1;
  (this_01->bottom).c = -1;
  (this_01->bottom).i = 0;
  (this_01->bottom).m.ptr = (QAbstractItemModel *)0x0;
  local_58.d.size = 0;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_88.d.size = 0;
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (char16_t *)0x0;
  local_a8.d.size = 0;
  local_a8.d.d = (Data *)0x0;
  local_a8.d.ptr = (char16_t *)0x0;
  QSqlError::QSqlError(&local_68,&local_58,&local_88,NoError,&local_a8);
  QVar3.d.ptr = (totally_ordered_wrapper<QSqlErrorPrivate_*>)(this_01->error).d.d.ptr;
  (this_01->error).d.d.ptr = (QSqlErrorPrivate *)local_68.d.d.ptr;
  local_68.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlErrorPrivate>)
       (QExplicitlySharedDataPointer<QSqlErrorPrivate>)QVar3.d.ptr;
  QSqlError::~QSqlError(&local_68);
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QSqlErrorPrivate *)local_88.d.d != (QSqlErrorPrivate *)0x0) {
    LOCK();
    (((QSharedData *)&(local_88.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_88.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)&(local_88.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  this_00 = &this_01->query;
  pQVar4 = query->d;
  query->d = (QSqlQueryPrivate *)0x0;
  local_58.d.d = (Data *)(this_01->query).d;
  (this_01->query).d = pQVar4;
  QSqlQuery::~QSqlQuery((QSqlQuery *)&local_58);
  QSqlRecord::operator=(other,&local_60);
  this_01->field_0x108 = this_01->field_0x108 | 1;
  bVar6 = QSqlQuery::isForwardOnly(this_00);
  if (bVar6) {
    QVar11.m_data = (storage_type *)0x33;
    QVar11.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar11);
    local_88.d.d = local_58.d.d;
    local_88.d.ptr = local_58.d.ptr;
    local_88.d.size = local_58.d.size;
    local_58.d.size = 0;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    local_a8.d.size = 0;
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (char16_t *)0x0;
    QSqlError::QSqlError(&local_68,&local_88,&local_58,ConnectionError,&local_a8);
    QVar3.d.ptr = (totally_ordered_wrapper<QSqlErrorPrivate_*>)(this_01->error).d.d.ptr;
    (this_01->error).d.d.ptr = (QSqlErrorPrivate *)local_68.d.d.ptr;
    local_68.d.d.ptr =
         (QExplicitlySharedDataPointer<QSqlErrorPrivate>)
         (QExplicitlySharedDataPointer<QSqlErrorPrivate>)QVar3.d.ptr;
    QSqlError::~QSqlError(&local_68);
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QSqlErrorPrivate *)local_58.d.d != (QSqlErrorPrivate *)0x0) {
      LOCK();
      (((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            (((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)
          (((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QSqlErrorPrivate *)local_88.d.d != (QSqlErrorPrivate *)0x0) {
      LOCK();
      (((QSharedData *)&(local_88.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)&(local_88.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QSharedData *)&(local_88.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    bVar6 = QSqlQuery::isActive(this_00);
    if (bVar6) {
      pQVar10 = QSqlQuery::driver(this_00);
      cVar7 = (**(code **)(*(long *)pQVar10 + 0xb8))(pQVar10,1);
      if (cVar7 == '\0') {
LAB_0012d225:
        iVar8 = QSqlRecord::count(other);
        (this_01->bottom).r = -1;
        (this_01->bottom).c = iVar8 + -1;
        (this_01->bottom).i = 0;
        (this_01->bottom).m.ptr = (QAbstractItemModel *)this;
        this_01->field_0x108 = this_01->field_0x108 & 0xfe;
      }
      else {
        iVar8 = QSqlQuery::size(this_00);
        if (iVar8 < 1) goto LAB_0012d225;
        iVar8 = QSqlQuery::size(this_00);
        iVar9 = QSqlRecord::count(other);
        (this_01->bottom).r = iVar8 + -1;
        (this_01->bottom).c = iVar9 + -1;
        (this_01->bottom).i = 0;
        (this_01->bottom).m.ptr = (QAbstractItemModel *)this;
      }
      local_58.d.d = (Data *)0xffffffffffffffff;
      local_58.d.ptr = (char16_t *)0x0;
      local_58.d.size = 0;
      (**(code **)(*(long *)this + 0x128))(this);
      piVar1 = (int *)(*(long *)&this->field_0x8 + 0x220);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        QAbstractItemModel::endResetModel();
      }
      (**(code **)(*(long *)this + 400))(this);
      goto LAB_0012d29a;
    }
    QSqlQuery::lastError((QSqlQuery *)&local_58);
    pQVar5 = (this_01->error).d.d.ptr;
    (this_01->error).d.d.ptr = (QSqlErrorPrivate *)local_58.d.d;
    local_58.d.d = (Data *)pQVar5;
    QSqlError::~QSqlError((QSqlError *)&local_58);
  }
  piVar1 = (int *)(*(long *)&this->field_0x8 + 0x220);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    QAbstractItemModel::endResetModel();
  }
LAB_0012d29a:
  QSqlRecord::~QSqlRecord(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlQueryModel::setQuery(QSqlQuery &&query)
{
    Q_D(QSqlQueryModel);
    beginResetModel();

    QSqlRecord newRec = query.record();
    bool columnsChanged = (newRec != d->rec);

    if (d->colOffsets.size() != newRec.count() || columnsChanged)
        d->initColOffsets(newRec.count());

    d->bottom = QModelIndex();
    d->error = QSqlError();
    d->query = std::move(query);
    d->rec = newRec;
    d->atEnd = true;

    if (d->query.isForwardOnly()) {
        d->error = QSqlError("Forward-only queries cannot be used in a data model"_L1,
                             QString(), QSqlError::ConnectionError);
        endResetModel();
        return;
    }

    if (!d->query.isActive()) {
        d->error = d->query.lastError();
        endResetModel();
        return;
    }

    if (d->query.driver()->hasFeature(QSqlDriver::QuerySize) && d->query.size() > 0) {
        d->bottom = createIndex(d->query.size() - 1, d->rec.count() - 1);
    } else {
        d->bottom = createIndex(-1, d->rec.count() - 1);
        d->atEnd = false;
    }


    // fetchMore does the rowsInserted stuff for incremental models
    fetchMore();

    endResetModel();
    queryChange();
}